

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

char * isEnv(Proto *p,int pc,Instruction i,int isup)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  uint reg;
  int local_14;
  char *local_10;
  
  reg = i >> 0x10 & 0xff;
  local_14 = pc;
  if (isup == 0) {
    basicgetobjname(p,&local_14,reg,&local_10);
    if (local_10 == (char *)0x0) {
      return "field";
    }
  }
  else {
    lVar1 = *(long *)((long)&p->upvalues->name + (ulong)(reg << 4));
    local_10 = "?";
    if (lVar1 != 0) {
      local_10 = (char *)(lVar1 + 0x18);
    }
  }
  iVar2 = strcmp(local_10,"_ENV");
  pcVar3 = "field";
  if (iVar2 == 0) {
    pcVar3 = "global";
  }
  return pcVar3;
}

Assistant:

static const char *isEnv (const Proto *p, int pc, Instruction i, int isup) {
  int t = GETARG_B(i);  /* table index */
  const char *name;  /* name of indexed variable */
  if (isup)  /* is 't' an upvalue? */
    name = upvalname(p, t);
  else  /* 't' is a register */
    basicgetobjname(p, &pc, t, &name);
  return (name && strcmp(name, LUA_ENV) == 0) ? "global" : "field";
}